

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rule.cpp
# Opt level: O3

void __thiscall Rule::Rule(Rule *this,string *line)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  RX *this_00;
  string *psVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  long *plVar7;
  undefined4 *puVar8;
  ulong *puVar9;
  pointer pbVar10;
  _Alloc_hider _Var11;
  ulong uVar12;
  string rest;
  string color_name;
  string pattern;
  string rest_1;
  Nibbler n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string local_1b8;
  string local_198;
  Color *local_170;
  string local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  RX *local_130;
  string *local_128;
  undefined1 local_120 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_108 [5];
  Nibbler local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string *local_38;
  
  this->_vptr_Rule = (_func_int **)&PTR__Rule_00113d78;
  local_138 = &(this->section).field_2;
  (this->section)._M_dataplus._M_p = (pointer)local_138;
  (this->section)._M_string_length = 0;
  (this->section).field_2._M_local_buf[0] = '\0';
  local_170 = &this->color;
  local_38 = &this->section;
  Color::Color(local_170);
  psVar1 = &this->context;
  local_140 = &(this->context).field_2;
  (this->context)._M_dataplus._M_p = (pointer)local_140;
  (this->context)._M_string_length = 0;
  (this->context).field_2._M_local_buf[0] = '\0';
  RX::RX(&this->rx);
  local_128 = (string *)&this->fragment;
  local_148 = &(this->fragment).field_2;
  (this->fragment)._M_dataplus._M_p = (pointer)local_148;
  (this->fragment)._M_string_length = 0;
  (this->fragment).field_2._M_local_buf[0] = '\0';
  local_130 = &this->rx;
  std::__cxx11::string::_M_replace((ulong)local_128,0,(char *)0x0,0x10f258);
  Nibbler::Nibbler(&local_b0,line);
  Nibbler::skipWS(&local_b0);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  bVar4 = Nibbler::getUntilWS(&local_b0,&this->section);
  if ((!bVar4) || (bVar4 = Nibbler::skipWS(&local_b0), !bVar4)) goto LAB_0010ace2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_120 + 0x10);
  local_120._0_8_ = paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"rule","");
  bVar4 = Nibbler::getLiteral(&local_b0,(string *)local_120);
  if (bVar4) {
    bVar4 = Nibbler::skipWS(&local_b0);
  }
  else {
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ != paVar2) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  if (bVar4 == false) goto LAB_0010ace2;
  bVar4 = Nibbler::getQuoted(&local_b0,'/',&local_168,false);
  if ((bVar4) && (bVar4 = Nibbler::skipWS(&local_b0), bVar4)) {
    local_120._0_8_ = paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"-->","");
    bVar4 = Nibbler::getLiteral(&local_b0,(string *)local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ != paVar2) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    if (!bVar4) goto LAB_0010a983;
    Nibbler::skipWS(&local_b0);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_local_buf[0] = '\0';
    Nibbler::getRemainder(&local_b0,&local_1b8);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    local_198._M_string_length = 0;
    local_198.field_2._M_allocated_capacity =
         local_198.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    split(&local_58,&local_1b8,' ');
    if (local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar10 = local_58.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (pbVar10->_M_string_length != 0) {
          iVar5 = std::__cxx11::string::compare((char *)pbVar10);
          if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)pbVar10), iVar5 == 0))
             || ((iVar5 = std::__cxx11::string::compare((char *)pbVar10), iVar5 == 0 ||
                 (iVar5 = std::__cxx11::string::compare((char *)pbVar10), iVar5 == 0)))) {
            std::__cxx11::string::_M_assign((string *)psVar1);
          }
          else {
            if ((ulong *)local_198._M_string_length != (ulong *)0x0) {
              std::__cxx11::string::append((char *)&local_198);
            }
            std::__cxx11::string::_M_append((char *)&local_198,(ulong)(pbVar10->_M_dataplus)._M_p);
          }
        }
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 !=
               local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    Color::Color((Color *)local_120,&local_198);
    this_00 = local_130;
    Color::operator=(local_170,(Color *)local_120);
    Color::~Color((Color *)local_120);
    iVar5 = std::__cxx11::string::compare((char *)psVar1);
    if ((iVar5 == 0) && (lVar6 = std::__cxx11::string::find((char)&local_168,0x28), lVar6 == -1)) {
      std::operator+(&local_78,"(",&local_168);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_78);
      puVar9 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_120._16_8_ = *puVar9;
        aaStack_108[0]._0_8_ = plVar7[3];
        local_120._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_120 + 0x10);
      }
      else {
        local_120._16_8_ = *puVar9;
        local_120._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar7;
      }
      local_120._8_8_ = plVar7[1];
      *plVar7 = (long)puVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_168,(string *)local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_120 + 0x10)) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    RX::RX((RX *)local_120,&local_168,true);
    RX::operator=(this_00,(RX *)local_120);
    RX::~RX((RX *)local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p == &local_1b8.field_2) goto LAB_0010abc1;
    uVar12 = CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                      local_1b8.field_2._M_local_buf[0]);
    _Var11._M_p = local_1b8._M_dataplus._M_p;
  }
  else {
LAB_0010a983:
    bVar4 = Nibbler::getQuoted(&local_b0,'\"',&local_168,false);
    if ((!bVar4) || (bVar4 = Nibbler::skipWS(&local_b0), !bVar4)) {
LAB_0010ace2:
      puVar8 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar8 = 1;
      __cxa_throw(puVar8,&int::typeinfo,0);
    }
    local_120._0_8_ = paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"-->","");
    bVar4 = Nibbler::getLiteral(&local_b0,(string *)local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ != paVar2) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    if (!bVar4) goto LAB_0010ace2;
    Nibbler::skipWS(&local_b0);
    local_120._8_8_ = (pointer)0x0;
    local_120._16_8_ = local_120._16_8_ & 0xffffffffffffff00;
    local_120._0_8_ = paVar2;
    Nibbler::getRemainder(&local_b0,(string *)local_120);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_local_buf[0] = '\0';
    local_198.field_2._M_allocated_capacity = 0;
    local_198._M_dataplus._M_p = (pointer)0x0;
    local_198._M_string_length = 0;
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_198,(string *)local_120,' ');
    if (local_198._M_dataplus._M_p != (pointer)local_198._M_string_length) {
      _Var11._M_p = local_198._M_dataplus._M_p;
      do {
        if (*(ulong *)((long)_Var11._M_p + 8) != 0) {
          iVar5 = std::__cxx11::string::compare(_Var11._M_p);
          if ((((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare(_Var11._M_p), iVar5 == 0)) ||
              (iVar5 = std::__cxx11::string::compare(_Var11._M_p), iVar5 == 0)) ||
             (iVar5 = std::__cxx11::string::compare(_Var11._M_p), iVar5 == 0)) {
            std::__cxx11::string::_M_assign((string *)psVar1);
          }
          else {
            if (local_1b8._M_string_length != 0) {
              std::__cxx11::string::append((char *)&local_1b8);
            }
            std::__cxx11::string::_M_append((char *)&local_1b8,*(ulong *)_Var11._M_p);
          }
        }
        _Var11._M_p = _Var11._M_p + 0x20;
      } while (_Var11._M_p != (pointer)local_198._M_string_length);
    }
    Color::Color((Color *)&local_78,&local_1b8);
    psVar3 = local_128;
    Color::operator=(local_170,(Color *)&local_78);
    Color::~Color((Color *)&local_78);
    std::__cxx11::string::_M_assign(psVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,
                      CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                               local_1b8.field_2._M_local_buf[0]) + 1);
    }
    uVar12 = local_120._16_8_;
    _Var11._M_p = (pointer)local_120._0_8_;
    if ((undefined1 *)local_120._0_8_ == local_120 + 0x10) goto LAB_0010abc1;
  }
  operator_delete(_Var11._M_p,uVar12 + 1);
LAB_0010abc1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,
                    CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                             local_168.field_2._M_local_buf[0]) + 1);
  }
  Nibbler::~Nibbler(&local_b0);
  return;
}

Assistant:

Rule::Rule (const std::string& line)
{
  fragment = "";

  Nibbler n (line);
  n.skipWS ();

  std::string pattern;
  if (n.getUntilWS (section)     &&
      n.skipWS ()                &&
      n.getLiteral ("rule")      &&
      n.skipWS ())
  {
    // <section> rule /<pattern>/
    if (n.getQuoted ('/', pattern) &&
        n.skipWS ()                &&
        n.getLiteral ("-->"))
    {
      n.skipWS ();

      std::string rest;
      n.getRemainder (rest);

      std::string color_name;
      std::vector <std::string> words;
      split (words, rest, ' ');
      std::vector <std::string>::iterator i;
      for (i = words.begin (); i != words.end (); ++i)
      {
        if (i->length ())
        {
               if (*i == "line")      context = *i;
          else if (*i == "match")     context = *i;
          else if (*i == "suppress")  context = *i;
          else if (*i == "blank")     context = *i;
          else
          {
            if (color_name.length ())
              color_name += " ";

            color_name += *i;
          }
        }
      }

      color = Color (color_name);

      // Now for "match" context patterns, add an enclosing ( ... ) is not
      // already present.
      if (context == "match")
        if (pattern.find ('(') == std::string::npos)
          pattern = "(" + pattern + ")";

      rx = RX (pattern, true);
      return;
    }

    // <section> rule "<pattern>"
    else if (n.getQuoted ('"', pattern) &&
             n.skipWS ()                &&
             n.getLiteral ("-->"))
    {
      n.skipWS ();

      std::string rest;
      n.getRemainder (rest);

      std::string color_name;
      std::vector <std::string> words;
      split (words, rest, ' ');
      std::vector <std::string>::iterator i;
      for (i = words.begin (); i != words.end (); ++i)
      {
        if (i->length ())
        {
               if (*i == "line")      context = *i;
          else if (*i == "match")     context = *i;
          else if (*i == "suppress")  context = *i;
          else if (*i == "blank")     context = *i;
          // TODO Support context "datetime", "time"
          else
          {
            if (color_name.length ())
              color_name += " ";

            color_name += *i;
          }
        }
      }

      color = Color (color_name);
      fragment = pattern;
      return;
    }
  }

  // Indicates that 'line' was not a rule def, but a blank line or similar.
  throw int (1);
}